

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

int snprintf_long_canframe(char *buf,size_t size,cu_t *cu,int view)

{
  __u8 _Var1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  byte bVar7;
  char cVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  byte *pbVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  
  if (size == 0) {
    size = 0;
    goto LAB_00102383;
  }
  bVar9 = (cu->fd).len;
  if ((char)bVar9 < '\0') {
    uVar4 = (uint)(cu->xl).len;
    uVar19 = 0x40;
    if ((cu->xl).len < 0x40) {
      uVar19 = uVar4;
    }
    if ((ulong)(uVar19 * 3 + 0x29 & 0xffff) <= size - 1) {
      if ((view & 0x10U) == 0) {
        uVar3 = (cu->cc).can_id & 0x7ff;
        lVar17 = 3;
        do {
          buf[lVar17 + -1] = "0123456789ABCDEF"[uVar3 & 0xf];
          uVar3 = uVar3 >> 4;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
        lVar17 = 3;
      }
      else {
        builtin_strncpy(buf,"     ",5);
        uVar3 = (cu->cc).can_id & 0x7ff;
        lVar17 = 7;
        do {
          buf[lVar17] = "0123456789ABCDEF"[uVar3 & 0xf];
          uVar3 = uVar3 >> 4;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 4);
        lVar17 = 8;
      }
      iVar20 = sprintf(buf + lVar17," [%04d] (%02X|%02X:%02X:%08X) ",(ulong)uVar4,
                       (ulong)(byte)cu->field3[2],(ulong)(cu->fd).len,(ulong)(cu->cc).__pad,
                       CONCAT44((int)((ulong)in_RAX >> 0x20),(cu->xl).af));
      uVar3 = iVar20 + (int)lVar17;
      if (uVar4 == 0) {
        size = (size_t)uVar3;
      }
      else {
        uVar10 = 0;
        do {
          lVar17 = (long)(int)uVar3;
          bVar9 = cu->field3[uVar10 + 0xc];
          buf[lVar17] = "0123456789ABCDEF"[bVar9 >> 4];
          buf[lVar17 + 1] = "0123456789ABCDEF"[bVar9 & 0xf];
          size = lVar17 + 2;
          uVar10 = uVar10 + 1;
          if (uVar10 < uVar19) {
            buf[size] = ' ';
            size = (size_t)(uVar3 + 3);
          }
          uVar3 = (uint)size;
        } while (uVar19 != uVar10);
      }
      if ((ushort)uVar19 < (cu->xl).len) {
        iVar20 = (int)size;
        buf[(long)iVar20 + 4] = '\0';
        builtin_strncpy(buf + iVar20," ...",4);
        size = (size_t)(iVar20 + 4);
      }
      buf[(int)size] = '\0';
      goto LAB_00102383;
    }
  }
  else {
    _Var1 = (cu->cc).__pad;
    uVar19 = 0x40;
    if (bVar9 < 0x40) {
      uVar19 = (uint)bVar9;
    }
    uVar10 = 8;
    if (bVar9 < 8) {
      uVar10 = (ulong)(uint)bVar9;
    }
    bVar7 = (byte)uVar19;
    if (_Var1 == '\0') {
      bVar7 = (byte)uVar10;
    }
    iVar20 = 9;
    if ((view & 2U) == 0) {
      iVar20 = 3;
    }
    uVar16 = 0x24;
    if (((cu->cc).can_id >> 0x1e & 1) == 0) {
      uVar5 = (ulong)(iVar20 * (uint)bVar7);
      uVar16 = uVar5 + 0x11;
      if ((bVar7 < 9) && ((((cu->cc).can_id >> 0x1d & 1) != 0 || ((view & 1U) != 0)))) {
        uVar16 = (8 - (uint)bVar7) * iVar20 + uVar5 + 0x20;
      }
    }
    if (uVar16 <= size - 1) {
      builtin_strncpy(buf,"               ",0xf);
      uVar4 = (cu->cc).can_id;
      if ((uVar4 >> 0x1d & 1) == 0) {
        if ((int)uVar4 < 0) {
          uVar4 = uVar4 & 0x1fffffff;
          lVar17 = 8;
          do {
            buf[lVar17 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
            uVar4 = uVar4 >> 4;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
          goto LAB_00101fd1;
        }
        uVar4 = uVar4 & 0x7ff;
        if ((view & 0x10U) != 0) {
          lVar17 = 7;
          do {
            buf[lVar17] = "0123456789ABCDEF"[uVar4 & 0xf];
            uVar4 = uVar4 >> 4;
            lVar17 = lVar17 + -1;
          } while (lVar17 != 4);
          goto LAB_00101fd1;
        }
        lVar17 = 3;
        do {
          buf[lVar17 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
          uVar4 = uVar4 >> 4;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
        uVar4 = 5;
      }
      else {
        uVar4 = uVar4 & 0x3fffffff;
        lVar17 = 8;
        do {
          buf[lVar17 + -1] = "0123456789ABCDEF"[uVar4 & 0xf];
          uVar4 = uVar4 >> 4;
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
LAB_00101fd1:
        uVar4 = 10;
      }
      uVar16 = (ulong)uVar4;
      if (_Var1 == '\0') {
        if ((view & 0x20U) == 0) {
          buf[uVar16 + 1] = '[';
          bVar9 = (byte)uVar10 | 0x30;
          cVar8 = ']';
        }
        else {
          uVar5 = (ulong)(cu->cc).len8_dlc;
          if (6 < (byte)((cu->cc).len8_dlc - 9)) {
            uVar5 = uVar10;
          }
          if (bVar9 < 8) {
            uVar5 = uVar10;
          }
          buf[uVar16 + 1] = '{';
          bVar9 = "0123456789ABCDEF"[uVar5];
          cVar8 = '}';
        }
        buf[uVar16 + 2] = bVar9;
        buf[uVar16 + 3] = cVar8;
        if ((cu->field3[3] & 0x40) != 0) {
          builtin_strncpy(buf + uVar16 + 5," remote request",0x10);
          size = (size_t)(uVar4 + 0x14);
          goto LAB_00102383;
        }
      }
      else {
        buf[uVar16] = '[';
        bVar9 = (byte)(uVar19 / 10);
        buf[uVar16 + 1] = bVar9 | 0x30;
        buf[uVar16 + 2] = (byte)uVar19 + bVar9 * -10 | 0x30;
        buf[uVar16 + 3] = ']';
      }
      size = uVar16 + 5;
      uVar19 = (uint)bVar7;
      uVar3 = (uint)bVar7;
      if ((view & 2U) == 0) {
        if ((view & 4U) == 0) {
          if (uVar19 != 0) {
            uVar10 = (ulong)(uVar4 + 5);
            uVar16 = 0;
            do {
              buf[uVar10] = ' ';
              bVar9 = cu->field3[uVar16 + 8];
              buf[uVar10 + 1] = "0123456789ABCDEF"[bVar9 >> 4];
              buf[uVar10 + 2] = "0123456789ABCDEF"[bVar9 & 0xf];
              uVar10 = uVar10 + 3;
              uVar16 = uVar16 + 1;
            } while ((uint)bVar7 != uVar16);
LAB_001021c1:
            size = uVar10 & 0xffffffff;
            goto LAB_00102240;
          }
        }
        else if (uVar19 != 0) {
          uVar10 = (ulong)(uVar4 + 5);
          lVar17 = (ulong)(bVar7 - 1) + 1;
          lVar18 = 0;
          do {
            buf[uVar10] = (lVar18 != 0) << 6 | 0x20;
            bVar9 = cu->field3[lVar18 + (ulong)(bVar7 - 1) + 8];
            buf[uVar10 + 1] = "0123456789ABCDEF"[bVar9 >> 4];
            buf[uVar10 + 2] = "0123456789ABCDEF"[bVar9 & 0xf];
            uVar10 = uVar10 + 3;
            lVar11 = lVar17 + -1;
            bVar2 = 0 < lVar17;
            lVar17 = lVar11;
            lVar18 = lVar18 + -1;
          } while (lVar11 != 0 && bVar2);
          goto LAB_001021c1;
        }
LAB_00102256:
        buf[size] = '\0';
        sVar12 = size;
      }
      else {
        if ((view & 4U) != 0) {
          if (uVar3 != 0) {
            uVar10 = (ulong)(bVar7 - 1);
            do {
              iVar6 = (int)size;
              buf[iVar6] = (uVar10 != bVar7 - 1) << 6 | 0x20;
              pbVar15 = (byte *)(buf + (iVar6 + 1));
              iVar14 = -1;
              do {
                *pbVar15 = ((byte)cu->field3[uVar10 + 8] >> (iVar14 + 8U & 0x1f) & 1) == 0 ^ 0x31;
                pbVar15 = pbVar15 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != -9);
              size = (size_t)(iVar6 + 9);
              bVar2 = 0 < (long)uVar10;
              uVar10 = uVar10 - 1;
            } while (bVar2);
            size = (size_t)(iVar6 + 9);
            goto LAB_00102240;
          }
          goto LAB_00102256;
        }
        if (uVar3 == 0) goto LAB_00102256;
        uVar10 = 0;
        do {
          iVar6 = (int)size;
          buf[iVar6] = ' ';
          pbVar15 = (byte *)(buf + (iVar6 + 1));
          iVar14 = -1;
          do {
            *pbVar15 = ((byte)cu->field3[uVar10 + 8] >> (iVar14 + 8U & 0x1f) & 1) == 0 ^ 0x31;
            pbVar15 = pbVar15 + 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != -9);
          size = (size_t)(iVar6 + 9);
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar19);
        size = (size_t)(iVar6 + 9);
LAB_00102240:
        sVar12 = (size_t)(int)size;
        buf[sVar12] = '\0';
        if (8 < bVar7) goto LAB_00102383;
      }
      pcVar13 = buf + sVar12;
      iVar14 = (int)size;
      if ((cu->field3[3] & 0x20) == 0) {
        if ((view & 1U) != 0) {
          iVar20 = (8 - uVar3) * iVar20;
          iVar6 = iVar14 + iVar20 + 4;
          if ((view & 4U) == 0) {
            sprintf(pcVar13,"%*s",(ulong)(iVar20 + 4),"\'");
            if (uVar3 != 0) {
              uVar10 = 0;
              do {
                cVar8 = cu->field3[uVar10 + 8];
                if (0x5e < (byte)(cVar8 - 0x20U)) {
                  cVar8 = '.';
                }
                buf[uVar10 + (long)iVar6] = cVar8;
                uVar10 = uVar10 + 1;
              } while (uVar19 != uVar10);
              iVar6 = iVar6 + (int)uVar10;
            }
            (buf + iVar6)[0] = '\'';
            (buf + iVar6)[1] = '\0';
          }
          else {
            sprintf(pcVar13,"%*s",(ulong)(iVar20 + 4),"`");
            if (bVar7 != 0) {
              pcVar13 = buf + iVar6;
              iVar6 = (uint)bVar7 + iVar14 + iVar20 + 4;
              uVar10 = (ulong)uVar3;
              do {
                cVar8 = cu->field3[uVar10 + 7];
                if (0x5e < (byte)(cVar8 - 0x20U)) {
                  cVar8 = '.';
                }
                *pcVar13 = cVar8;
                pcVar13 = pcVar13 + 1;
                bVar2 = 1 < uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar2);
            }
            (buf + iVar6)[0] = '`';
            (buf + iVar6)[1] = '\0';
          }
          size = (size_t)(iVar6 + 1);
        }
      }
      else {
        iVar20 = sprintf(pcVar13,"%*s",(ulong)((8 - uVar3) * iVar20 + 0xd),"ERRORFRAME");
        size = (size_t)(uint)(iVar20 + iVar14);
      }
      goto LAB_00102383;
    }
  }
  memset(buf,0x2d,size - 1);
  buf[size - 1] = '\0';
LAB_00102383:
  return (int)size;
}

Assistant:

int snprintf_long_canframe(char *buf, size_t size, cu_t *cu, int view)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, j, dlen, offset;
	size_t maxsize;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* crop to CANFD_MAX_DLEN */
		if (len > CANFD_MAX_DLEN)
			dlen = CANFD_MAX_DLEN;
		else
			dlen = len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof(".....123 [2048] (00|11:22:12345678)  ...") + 3 * dlen > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		if (view & CANLIB_VIEW_INDENT_SFF) {
			memset(buf, ' ', 5);
			put_sff_id(buf + 5, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 8;
		} else {
			put_sff_id(buf, cu->xl.prio & CANXL_PRIO_MASK);
			offset = 3;
		}

		/* print prio and CAN XL header content */
		offset += sprintf(buf + offset, " [%04d] (%02X|%02X:%02X:%08X) ",
				  len,
				  (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				  cu->xl.flags, cu->xl.sdt, cu->xl.af);

		for (i = 0; i < dlen; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (i + 1 < dlen)
				buf[offset++] = ' ';
		}

		/* indicate cropped output */
		if (cu->xl.len > dlen)
			offset += sprintf(buf + offset, " ...");

		buf[offset] = 0;

		return offset;
	}

	/* ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	maxsize = sizeof("12345678  [12]  ");
	if (view & CANLIB_VIEW_BINARY)
		dlen = 9; /* _10101010 */
	else
		dlen = 3; /* _AA */

	if (cu->fd.can_id & CAN_RTR_FLAG) {
		maxsize += sizeof("    remote request");
	} else {
		maxsize += len * dlen;

		if (len <= CAN_MAX_DLEN) {
			if (cu->fd.can_id & CAN_ERR_FLAG) {
				maxsize += sizeof("    ERRORFRAME");
				maxsize += (8 - len) * dlen;
			} else if (view & CANLIB_VIEW_ASCII) {
				maxsize += sizeof("    'a.b.CDEF'");
				maxsize += (8 - len) * dlen;
			}
		}
	}

	if (maxsize > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	/* initialize space for CAN-ID and length information */
	memset(buf, ' ', 15);

	if (cu->cc.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->cc.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		offset = 10;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		offset = 10;
	} else {
		if (view & CANLIB_VIEW_INDENT_SFF) {
			put_sff_id(buf + 5, cu->fd.can_id & CAN_SFF_MASK);
			offset = 10;
		} else {
			put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
			offset = 5;
		}
	}

	/* The len value is sanitized (see above) */
	if (!is_canfd) {
		if (view & CANLIB_VIEW_LEN8_DLC) {
			unsigned char dlc = cu->cc.len8_dlc;

			/* fall back to len if we don't have a valid DLC > 8 */
			if (!((len == CAN_MAX_DLEN) && (dlc > CAN_MAX_DLEN) &&
			      (dlc <= CAN_MAX_RAW_DLC)))
				dlc = len;

			buf[offset + 1] = '{';
			buf[offset + 2] = hex_asc_upper[dlc];
			buf[offset + 3] = '}';
		} else {
			buf[offset + 1] = '[';
			buf[offset + 2] = len + '0';
			buf[offset + 3] = ']';
		}

		/* standard CAN frames may have RTR enabled */
		if (cu->fd.can_id & CAN_RTR_FLAG) {
			offset += sprintf(buf + offset + 5, " remote request");
			return offset + 5;
		}
	} else {
		buf[offset] = '[';
		buf[offset + 1] = (len / 10) + '0';
		buf[offset + 2] = (len % 10) + '0';
		buf[offset + 3] = ']';
	}
	offset += 5;

	if (view & CANLIB_VIEW_BINARY) {
		/* _10101010 - dlen = 9, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				buf[offset++] = (i == len - 1) ? ' ' : SWAP_DELIMITER;
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				for (j = 7; j >= 0; j--)
					buf[offset++] = (1 << j & cu->fd.data[i]) ? '1' : '0';
			}
		}
	} else {
		/* _AA - dlen = 3, see above */
		if (view & CANLIB_VIEW_SWAP) {
			for (i = len - 1; i >= 0; i--) {
				if (i == len - 1)
					buf[offset++] = ' ';
				else
					buf[offset++] = SWAP_DELIMITER;

				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		} else {
			for (i = 0; i < len; i++) {
				buf[offset++] = ' ';
				put_hex_byte(buf + offset, cu->fd.data[i]);
				offset += 2;
			}
		}
	}

	buf[offset] = 0; /* terminate string */

	/*
	 * The ASCII & ERRORFRAME output is put at a fixed len behind the data.
	 * For now we support ASCII output only for payload length up to 8 bytes.
	 * Does it make sense to write 64 ASCII byte behind 64 ASCII HEX data on the console?
	 */
	if (len > CAN_MAX_DLEN)
		return offset;

	if (cu->fd.can_id & CAN_ERR_FLAG)
		offset += sprintf(buf + offset, "%*s", dlen * (8 - len) + 13, "ERRORFRAME");
	else if (view & CANLIB_VIEW_ASCII) {
		j = dlen * (8 - len) + 4;
		if (view & CANLIB_VIEW_SWAP) {
			sprintf(buf + offset, "%*s", j, "`");
			offset += j;
			for (i = len - 1; i >= 0; i--)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "`");
		} else {
			sprintf(buf + offset, "%*s", j, "'");
			offset += j;
			for (i = 0; i < len; i++)
				if ((cu->fd.data[i] > 0x1F) && (cu->fd.data[i] < 0x7F))
					buf[offset++] = cu->fd.data[i];
				else
					buf[offset++] = '.';

			offset += sprintf(buf + offset, "'");
		}
	}

	return offset;
}